

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall pugi::xml_node::child_value(xml_node *this)

{
  char_t *pcVar1;
  bool bVar2;
  long *in_RDI;
  char_t *ivalue;
  xml_node_struct *i;
  xml_node_struct *local_18;
  char *local_8;
  
  if (*in_RDI == 0) {
    local_8 = "";
  }
  else if ((((uint)*(undefined8 *)*in_RDI & 0xf) == 2) && (*(long *)(*in_RDI + 0x10) != 0)) {
    local_8 = *(char **)(*in_RDI + 0x10);
  }
  else {
    for (local_18 = *(xml_node_struct **)(*in_RDI + 0x20); local_18 != (xml_node_struct *)0x0;
        local_18 = local_18->next_sibling) {
      pcVar1 = local_18->value;
      bVar2 = impl::anon_unknown_0::is_text_node(local_18);
      if ((bVar2) && (pcVar1 != (char_t *)0x0)) {
        return pcVar1;
      }
    }
    local_8 = "";
  }
  return local_8;
}

Assistant:

PUGI_IMPL_FN const char_t* xml_node::child_value() const
	{
		if (!_root) return PUGIXML_TEXT("");

		// element nodes can have value if parse_embed_pcdata was used
		if (PUGI_IMPL_NODETYPE(_root) == node_element && _root->value)
			return _root->value;

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
		{
			const char_t* ivalue = i->value;
			if (impl::is_text_node(i) && ivalue)
				return ivalue;
		}

		return PUGIXML_TEXT("");
	}